

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O3

void luaL_addlstring(luaL_Buffer *B,char *s,size_t l)

{
  if ((ulong)((long)B + (0x2018 - (long)B->p)) < l) {
    emptybuffer(B);
    lua_pushlstring(B->L,s,l);
    B->lvl = B->lvl + 1;
    adjuststack(B);
    return;
  }
  memcpy(B->p,s,l);
  B->p = B->p + l;
  return;
}

Assistant:

LUALIB_API void luaL_addlstring(luaL_Buffer *B, const char *s, size_t l)
{
  if (l <= bufffree(B)) {
    memcpy(B->p, s, l);
    B->p += l;
  } else {
    emptybuffer(B);
    lua_pushlstring(B->L, s, l);
    B->lvl++;
    adjuststack(B);
  }
}